

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strchr.c
# Opt level: O0

int main(void)

{
  char *pcVar1;
  char local_12 [8];
  char abccd [6];
  
  stack0xfffffffffffffff4 = 0;
  local_12[0] = 'a';
  local_12[1] = 'b';
  local_12[2] = 'c';
  local_12[3] = 'c';
  local_12[4] = 'd';
  local_12[5] = '\0';
  pcVar1 = strchr(local_12,0x78);
  if (pcVar1 != (char *)0x0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strchr.c, line %d - %s\n"
           ,0x21,"strchr( abccd, \'x\' ) == NULL");
  }
  pcVar1 = strchr(local_12,0x61);
  if (pcVar1 != local_12) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strchr.c, line %d - %s\n"
           ,0x22,"strchr( abccd, \'a\' ) == &abccd[0]");
  }
  pcVar1 = strchr(local_12,100);
  if (pcVar1 != local_12 + 4) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strchr.c, line %d - %s\n"
           ,0x23,"strchr( abccd, \'d\' ) == &abccd[4]");
  }
  pcVar1 = strchr(local_12,0);
  if (pcVar1 != local_12 + 5) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strchr.c, line %d - %s\n"
           ,0x24,"strchr( abccd, \'\\0\' ) == &abccd[5]");
  }
  pcVar1 = strchr(local_12,99);
  if (pcVar1 != local_12 + 2) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strchr.c, line %d - %s\n"
           ,0x25,"strchr( abccd, \'c\' ) == &abccd[2]");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
    char abccd[] = "abccd";
    TESTCASE( strchr( abccd, 'x' ) == NULL );
    TESTCASE( strchr( abccd, 'a' ) == &abccd[0] );
    TESTCASE( strchr( abccd, 'd' ) == &abccd[4] );
    TESTCASE( strchr( abccd, '\0' ) == &abccd[5] );
    TESTCASE( strchr( abccd, 'c' ) == &abccd[2] );
    return TEST_RESULTS;
}